

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O3

string * __thiscall
pbrt::Bounds2<int>::ToString_abi_cxx11_(string *__return_storage_ptr__,Bounds2<int> *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<pbrt::Point2<int>const&,pbrt::Point2<int>const&>
            (__return_storage_ptr__,"[ %s - %s ]",&this->pMin,&this->pMax);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const { return StringPrintf("[ %s - %s ]", pMin, pMax); }